

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btSoftBody::eVSolver::_>::~btAlignedObjectArray
          (btAlignedObjectArray<btSoftBody::eVSolver::_> *this)

{
  clear(this);
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}